

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O0

void opj_v4dwt_decode(opj_v4dwt_t *dwt)

{
  OPJ_UINT32 OVar1;
  OPJ_UINT32 OVar2;
  opj_v4_t *poVar3;
  OPJ_UINT32 OVar4;
  undefined8 in_XMM1_Qa;
  __m128 c;
  __m128 c_00;
  __m128 c_01;
  __m128 c_02;
  __m128 c_03;
  __m128 c_04;
  int local_d8;
  int local_d4;
  OPJ_INT32 b;
  OPJ_INT32 a;
  opj_v4dwt_t *dwt_local;
  
  if (dwt->cas == 0) {
    if ((dwt->dn < 1) && (dwt->sn < 2)) {
      return;
    }
    local_d4 = 0;
    local_d8 = 1;
  }
  else {
    if ((dwt->sn < 1) && (dwt->dn < 2)) {
      return;
    }
    local_d4 = 1;
    local_d8 = 0;
  }
  c._8_8_ = in_XMM1_Qa;
  c[0] = 1.2301741;
  c[1] = 1.2301741;
  opj_v4dwt_decode_step1_sse(dwt->wavelet + local_d4,dwt->win_l_x0,dwt->win_l_x1,c);
  c_00[2] = (float)(int)in_XMM1_Qa;
  c_00[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
  c_00[0] = 1.6257324;
  c_00[1] = 1.6257324;
  opj_v4dwt_decode_step1_sse(dwt->wavelet + local_d8,dwt->win_h_x0,dwt->win_h_x1,c_00);
  poVar3 = dwt->wavelet;
  OVar1 = dwt->win_l_x0;
  OVar2 = dwt->win_l_x1;
  OVar4 = opj_int_min(dwt->sn,dwt->dn - local_d4);
  c_01[2] = (float)(int)in_XMM1_Qa;
  c_01[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
  c_01[0] = -0.44350687;
  c_01[1] = -0.44350687;
  opj_v4dwt_decode_step2_sse(poVar3 + local_d8,poVar3 + (long)local_d4 + 1,OVar1,OVar2,OVar4,c_01);
  poVar3 = dwt->wavelet;
  OVar1 = dwt->win_h_x0;
  OVar2 = dwt->win_h_x1;
  OVar4 = opj_int_min(dwt->dn,dwt->sn - local_d8);
  c_02[2] = (float)(int)in_XMM1_Qa;
  c_02[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
  c_02[0] = -0.8829111;
  c_02[1] = -0.8829111;
  opj_v4dwt_decode_step2_sse(poVar3 + local_d4,poVar3 + (long)local_d8 + 1,OVar1,OVar2,OVar4,c_02);
  poVar3 = dwt->wavelet;
  OVar1 = dwt->win_l_x0;
  OVar2 = dwt->win_l_x1;
  OVar4 = opj_int_min(dwt->sn,dwt->dn - local_d4);
  c_03[2] = (float)(int)in_XMM1_Qa;
  c_03[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
  c_03[0] = 0.052980117;
  c_03[1] = 0.052980117;
  opj_v4dwt_decode_step2_sse(poVar3 + local_d8,poVar3 + (long)local_d4 + 1,OVar1,OVar2,OVar4,c_03);
  poVar3 = dwt->wavelet;
  OVar1 = dwt->win_h_x0;
  OVar2 = dwt->win_h_x1;
  OVar4 = opj_int_min(dwt->dn,dwt->sn - local_d8);
  c_04[2] = (float)(int)in_XMM1_Qa;
  c_04[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
  c_04[0] = 1.5861343;
  c_04[1] = 1.5861343;
  opj_v4dwt_decode_step2_sse(poVar3 + local_d4,poVar3 + (long)local_d8 + 1,OVar1,OVar2,OVar4,c_04);
  return;
}

Assistant:

static void opj_v4dwt_decode(opj_v4dwt_t* OPJ_RESTRICT dwt)
{
    OPJ_INT32 a, b;
    if (dwt->cas == 0) {
        if (!((dwt->dn > 0) || (dwt->sn > 1))) {
            return;
        }
        a = 0;
        b = 1;
    } else {
        if (!((dwt->sn > 0) || (dwt->dn > 1))) {
            return;
        }
        a = 1;
        b = 0;
    }
#ifdef __SSE__
    opj_v4dwt_decode_step1_sse(dwt->wavelet + a, dwt->win_l_x0, dwt->win_l_x1,
                               _mm_set1_ps(opj_K));
    opj_v4dwt_decode_step1_sse(dwt->wavelet + b, dwt->win_h_x0, dwt->win_h_x1,
                               _mm_set1_ps(opj_c13318));
    opj_v4dwt_decode_step2_sse(dwt->wavelet + b, dwt->wavelet + a + 1,
                               dwt->win_l_x0, dwt->win_l_x1,
                               (OPJ_UINT32)opj_int_min(dwt->sn, dwt->dn - a),
                               _mm_set1_ps(opj_dwt_delta));
    opj_v4dwt_decode_step2_sse(dwt->wavelet + a, dwt->wavelet + b + 1,
                               dwt->win_h_x0, dwt->win_h_x1,
                               (OPJ_UINT32)opj_int_min(dwt->dn, dwt->sn - b),
                               _mm_set1_ps(opj_dwt_gamma));
    opj_v4dwt_decode_step2_sse(dwt->wavelet + b, dwt->wavelet + a + 1,
                               dwt->win_l_x0, dwt->win_l_x1,
                               (OPJ_UINT32)opj_int_min(dwt->sn, dwt->dn - a),
                               _mm_set1_ps(opj_dwt_beta));
    opj_v4dwt_decode_step2_sse(dwt->wavelet + a, dwt->wavelet + b + 1,
                               dwt->win_h_x0, dwt->win_h_x1,
                               (OPJ_UINT32)opj_int_min(dwt->dn, dwt->sn - b),
                               _mm_set1_ps(opj_dwt_alpha));
#else
    opj_v4dwt_decode_step1(dwt->wavelet + a, dwt->win_l_x0, dwt->win_l_x1,
                           opj_K);
    opj_v4dwt_decode_step1(dwt->wavelet + b, dwt->win_h_x0, dwt->win_h_x1,
                           opj_c13318);
    opj_v4dwt_decode_step2(dwt->wavelet + b, dwt->wavelet + a + 1,
                           dwt->win_l_x0, dwt->win_l_x1,
                           (OPJ_UINT32)opj_int_min(dwt->sn, dwt->dn - a),
                           opj_dwt_delta);
    opj_v4dwt_decode_step2(dwt->wavelet + a, dwt->wavelet + b + 1,
                           dwt->win_h_x0, dwt->win_h_x1,
                           (OPJ_UINT32)opj_int_min(dwt->dn, dwt->sn - b),
                           opj_dwt_gamma);
    opj_v4dwt_decode_step2(dwt->wavelet + b, dwt->wavelet + a + 1,
                           dwt->win_l_x0, dwt->win_l_x1,
                           (OPJ_UINT32)opj_int_min(dwt->sn, dwt->dn - a),
                           opj_dwt_beta);
    opj_v4dwt_decode_step2(dwt->wavelet + a, dwt->wavelet + b + 1,
                           dwt->win_h_x0, dwt->win_h_x1,
                           (OPJ_UINT32)opj_int_min(dwt->dn, dwt->sn - b),
                           opj_dwt_alpha);
#endif
}